

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mel_generalized_cepstral_analysis.cc
# Opt level: O2

void __thiscall
sptk::MelGeneralizedCepstralAnalysis::MelGeneralizedCepstralAnalysis
          (MelGeneralizedCepstralAnalysis *this,int fft_length,int num_order,double alpha,
          double gamma,int num_iteration,double convergence_threshold)

{
  double dVar1;
  int num_iteration_00;
  bool bVar2;
  MelCepstralAnalysis *this_00;
  
  this->_vptr_MelGeneralizedCepstralAnalysis =
       (_func_int **)&PTR__MelGeneralizedCepstralAnalysis_0011e4a0;
  this->fft_length_ = fft_length;
  this->num_order_ = num_order;
  this->alpha_ = alpha;
  this->gamma_ = gamma;
  this->num_iteration_ = num_iteration;
  this->convergence_threshold_ = convergence_threshold;
  RealValuedFastFourierTransform::RealValuedFastFourierTransform
            (&this->fourier_transform_,fft_length);
  RealValuedInverseFastFourierTransform::RealValuedInverseFastFourierTransform
            (&this->inverse_fourier_transform_,this->fft_length_);
  InverseFastFourierTransform::InverseFastFourierTransform
            (&this->complex_valued_inverse_fourier_transform_,this->fft_length_);
  ToeplitzPlusHankelSystemSolver::ToeplitzPlusHankelSystemSolver
            (&this->toeplitz_plus_hankel_system_solver_,this->num_order_ + -1,true);
  GeneralizedCepstrumGainNormalization::GeneralizedCepstrumGainNormalization
            (&this->generalized_cepstrum_gain_normalization_,this->num_order_,this->gamma_);
  GeneralizedCepstrumInverseGainNormalization::GeneralizedCepstrumInverseGainNormalization
            (&this->generalized_cepstrum_inverse_gain_normalization_gamma_minus_one_,
             this->num_order_,-1.0);
  GeneralizedCepstrumInverseGainNormalization::GeneralizedCepstrumInverseGainNormalization
            (&this->generalized_cepstrum_inverse_gain_normalization_,this->num_order_,this->gamma_);
  MelCepstrumToMlsaDigitalFilterCoefficients::MelCepstrumToMlsaDigitalFilterCoefficients
            (&this->mel_cepstrum_to_mlsa_digital_filter_coefficients_,this->num_order_,this->alpha_)
  ;
  MlsaDigitalFilterCoefficientsToMelCepstrum::MlsaDigitalFilterCoefficientsToMelCepstrum
            (&this->mlsa_digital_filter_coefficients_to_mel_cepstrum_,this->num_order_,this->alpha_)
  ;
  MelGeneralizedCepstrumToMelGeneralizedCepstrum::MelGeneralizedCepstrumToMelGeneralizedCepstrum
            (&this->mel_generalized_cepstrum_transform_,this->num_order_,0.0,-1.0,false,false,
             this->num_order_,0.0,this->gamma_,false,false);
  this->mel_cepstral_analysis_ = (MelCepstralAnalysis *)0x0;
  this->is_valid_ = true;
  bVar2 = IsValidGamma(this->gamma_);
  if ((((((!bVar2) || (dVar1 = this->gamma_, 0.0 < dVar1)) ||
        (num_iteration_00 = this->num_iteration_, num_iteration_00 < 0)) ||
       ((this->convergence_threshold_ <= 0.0 && this->convergence_threshold_ != 0.0 ||
        ((this->fourier_transform_).is_valid_ != true)))) ||
      (((this->inverse_fourier_transform_).fast_fourier_transform_.is_valid_ != true ||
       ((this->complex_valued_inverse_fourier_transform_).fast_fourier_transform_.is_valid_ != true)
       ))) || ((((gamma != 0.0 || (NAN(gamma))) &&
                ((this->toeplitz_plus_hankel_system_solver_).is_valid_ == false)) ||
               (((((this->generalized_cepstrum_gain_normalization_).is_valid_ != true ||
                  ((this->generalized_cepstrum_inverse_gain_normalization_).is_valid_ != true)) ||
                 ((this->mel_cepstrum_to_mlsa_digital_filter_coefficients_).is_valid_ != true)) ||
                (((this->mlsa_digital_filter_coefficients_to_mel_cepstrum_).is_valid_ != true ||
                 ((this->mel_generalized_cepstrum_transform_).is_valid_ == false)))))))) {
    this->is_valid_ = false;
  }
  else if ((dVar1 == 0.0) && (!NAN(dVar1))) {
    this_00 = (MelCepstralAnalysis *)operator_new(0x170);
    MelCepstralAnalysis::MelCepstralAnalysis
              (this_00,this->fft_length_,this->num_order_,this->alpha_,num_iteration_00,
               convergence_threshold);
    this->mel_cepstral_analysis_ = this_00;
  }
  return;
}

Assistant:

MelGeneralizedCepstralAnalysis::MelGeneralizedCepstralAnalysis(
    int fft_length, int num_order, double alpha, double gamma,
    int num_iteration, double convergence_threshold)
    : fft_length_(fft_length),
      num_order_(num_order),
      alpha_(alpha),
      gamma_(gamma),
      num_iteration_(num_iteration),
      convergence_threshold_(convergence_threshold),
      fourier_transform_(fft_length_),
      inverse_fourier_transform_(fft_length_),
      complex_valued_inverse_fourier_transform_(fft_length_),
      toeplitz_plus_hankel_system_solver_(num_order_ - 1, true),
      generalized_cepstrum_gain_normalization_(num_order_, gamma_),
      generalized_cepstrum_inverse_gain_normalization_gamma_minus_one_(
          num_order_, -1.0),
      generalized_cepstrum_inverse_gain_normalization_(num_order_, gamma_),
      mel_cepstrum_to_mlsa_digital_filter_coefficients_(num_order_, alpha_),
      mlsa_digital_filter_coefficients_to_mel_cepstrum_(num_order_, alpha_),
      mel_generalized_cepstrum_transform_(num_order_, 0.0, -1.0, false, false,
                                          num_order_, 0.0, gamma_, false,
                                          false),
      mel_cepstral_analysis_(NULL),
      is_valid_(true) {
  if (!sptk::IsValidGamma(gamma_) || 0.0 < gamma_ || num_iteration_ < 0 ||
      convergence_threshold_ < 0.0 || !fourier_transform_.IsValid() ||
      !inverse_fourier_transform_.IsValid() ||
      !complex_valued_inverse_fourier_transform_.IsValid() ||
      (!toeplitz_plus_hankel_system_solver_.IsValid() && 0.0 != gamma) ||
      !generalized_cepstrum_gain_normalization_.IsValid() ||
      !generalized_cepstrum_inverse_gain_normalization_.IsValid() ||
      !mel_cepstrum_to_mlsa_digital_filter_coefficients_.IsValid() ||
      !mlsa_digital_filter_coefficients_to_mel_cepstrum_.IsValid() ||
      !mel_generalized_cepstrum_transform_.IsValid()) {
    is_valid_ = false;
    return;
  }

  if (0.0 == gamma_) {
    mel_cepstral_analysis_ = new MelCepstralAnalysis(
        fft_length_, num_order_, alpha_, num_iteration_, convergence_threshold);
  }
}